

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

int try_lift(monst *mtmp,trap *ttmp,int wt,boolean stuff)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  
  iVar1 = weight_cap();
  if ((wt * 2) / iVar1 < 3) {
    iVar1 = 1;
  }
  else {
    pcVar3 = Monnam(mtmp);
    pcVar4 = "carrying too much";
    if (stuff == '\0') {
      pcVar4 = "too heavy";
    }
    iVar2 = 0;
    pline("%s is %s for you to lift.",pcVar3,pcVar4);
    iVar1 = 0;
    if ((((-1 < (char)ttmp->field_0x8) && ((*(uint *)&mtmp->field_0x60 & 0x440000) == 0x40000)) &&
        (iVar1 = iVar2, (mtmp->data->mflags1 & 0x10000) == 0)) && (mtmp->data->mlet != '5')) {
      iVar2 = rnl(10);
      if (iVar2 < 3) {
        mtmp->field_0x62 = mtmp->field_0x62 | 0x40;
        set_malign(mtmp);
        pcVar3 = Monnam(mtmp);
        iVar1 = 0;
        pline("%s thinks it was nice of you to try.",pcVar3);
      }
    }
  }
  return iVar1;
}

Assistant:

static int try_lift(struct monst *mtmp, struct trap *ttmp, int wt, boolean stuff)
{
	int wc = weight_cap();

	if (((wt * 2) / wc) >= HVY_ENCUMBER) {
	    pline("%s is %s for you to lift.", Monnam(mtmp),
		  stuff ? "carrying too much" : "too heavy");
	    if (!ttmp->madeby_u && !mtmp->mpeaceful && mtmp->mcanmove &&
		    !mindless(mtmp->data) &&
		    mtmp->data->mlet != S_HUMAN && rnl(10) < 3) {
		mtmp->mpeaceful = 1;
		set_malign(mtmp);		/* reset alignment */
		pline("%s thinks it was nice of you to try.", Monnam(mtmp));
	    }
	    return 0;
	}
	return 1;
}